

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O0

void __thiscall
vox::VoxWriter::m_MergeVoxelInCube
          (VoxWriter *this,VoxelX *vX,VoxelY *vY,VoxelZ *vZ,uint8_t *vColorIndex,VoxCube *vCube)

{
  VoxelX VVar1;
  VoxelY VVar2;
  VoxelZ VVar3;
  dvec3 pt;
  bool bVar4;
  size_type sVar5;
  mapped_type *this_00;
  mapped_type *this_01;
  mapped_type *this_02;
  mapped_type *pmVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint8_t local_d3;
  uint8_t local_d2;
  uint8_t local_d1;
  mapped_type *local_d0;
  mapped_type *xyzi;
  _Self local_c0;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *local_b8;
  mapped_type *vidkxy;
  _Self local_a8;
  map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
  *local_a0;
  mapped_type *vidkx;
  _Self local_90;
  map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>
  *local_88;
  mapped_type *vidk;
  _Self local_78;
  byte local_69;
  double dStack_68;
  bool exist;
  double local_60;
  double local_58;
  dvec3 local_50;
  VoxCube *local_38;
  VoxCube *vCube_local;
  uint8_t *vColorIndex_local;
  VoxelZ *vZ_local;
  VoxelY *vY_local;
  VoxelX *vX_local;
  VoxWriter *this_local;
  
  VVar1 = *vX;
  auVar8._8_4_ = (int)(VVar1 >> 0x20);
  auVar8._0_8_ = VVar1;
  auVar8._12_4_ = 0x45300000;
  local_58 = (auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)VVar1) - 4503599627370496.0);
  VVar2 = *vY;
  auVar9._8_4_ = (int)(VVar2 >> 0x20);
  auVar9._0_8_ = VVar2;
  auVar9._12_4_ = 0x45300000;
  local_60 = (auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)VVar2) - 4503599627370496.0);
  VVar3 = *vZ;
  auVar10._8_4_ = (int)(VVar3 >> 0x20);
  auVar10._0_8_ = VVar3;
  auVar10._12_4_ = 0x45300000;
  dStack_68 = (auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)VVar3) - 4503599627370496.0);
  local_38 = vCube;
  vCube_local = (VoxCube *)vColorIndex;
  vColorIndex_local = (uint8_t *)vZ;
  vZ_local = vY;
  vY_local = vX;
  vX_local = (VoxelX *)this;
  ct::dvec3::dvec3(&local_50,&local_58,&local_60,&stack0xffffffffffffff98);
  pt.y = local_50.y;
  pt.x = local_50.x;
  pt.z = local_50.z;
  ct::dAABBCC::Combine(&this->maxVolume,pt);
  local_69 = 0;
  local_78._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>_>_>_>
       ::find(&this->voxelId,&this->m_KeyFrame);
  vidk = (mapped_type *)
         std::
         map<unsigned_int,_std::map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>_>_>_>
         ::end(&this->voxelId);
  bVar4 = std::operator!=(&local_78,(_Self *)&vidk);
  if (bVar4) {
    local_88 = std::
               map<unsigned_int,_std::map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>_>_>_>
               ::at(&this->voxelId,&this->m_KeyFrame);
    local_90._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>
         ::find(local_88,vY_local);
    vidkx = (mapped_type *)
            std::
            map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>
            ::end(local_88);
    bVar4 = std::operator!=(&local_90,(_Self *)&vidkx);
    if (bVar4) {
      local_a0 = std::
                 map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>
                 ::at(local_88,vY_local);
      local_a8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
           ::find(local_a0,vZ_local);
      vidkxy = (mapped_type *)
               std::
               map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
               ::end(local_a0);
      bVar4 = std::operator!=(&local_a8,(_Self *)&vidkxy);
      if (bVar4) {
        local_b8 = std::
                   map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                   ::at(local_a0,vZ_local);
        local_c0._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::find(local_b8,(key_type_conflict *)vColorIndex_local);
        xyzi = (mapped_type *)
               std::
               map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ::end(local_b8);
        bVar4 = std::operator!=(&local_c0,(_Self *)&xyzi);
        if (bVar4) {
          local_69 = 1;
        }
      }
    }
  }
  if ((local_69 & 1) == 0) {
    local_d0 = std::
               map<unsigned_int,_vox::XYZI,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vox::XYZI>_>_>
               ::operator[](&local_38->xyzis,&this->m_KeyFrame);
    pvVar7 = &local_d0->voxels;
    local_d1 = Wrap(*vY_local,this->m_MaxVoxelPerCubeX);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pvVar7,&local_d1);
    pvVar7 = &local_d0->voxels;
    local_d2 = Wrap(*vZ_local,this->m_MaxVoxelPerCubeY);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pvVar7,&local_d2);
    pvVar7 = &local_d0->voxels;
    local_d3 = Wrap(*(size_t *)vColorIndex_local,this->m_MaxVoxelPerCubeZ);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(pvVar7,&local_d3);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_d0->voxels);
    this_00 = std::
              map<unsigned_int,_std::map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>_>_>_>
              ::operator[](&this->voxelId,&this->m_KeyFrame);
    this_01 = std::
              map<unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>
              ::operator[](this_00,vY_local);
    this_02 = std::
              map<unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
              ::operator[](this_01,vZ_local);
    pmVar6 = std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[](this_02,(key_type_conflict *)vColorIndex_local);
    *pmVar6 = (long)(int)sVar5;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&local_d0->voxels,(value_type_conflict *)vCube_local);
  }
  return;
}

Assistant:

void VoxWriter::m_MergeVoxelInCube(const VoxelX& vX, const VoxelY& vY, const VoxelZ& vZ, const uint8_t& vColorIndex, VoxCube* vCube) {
    maxVolume.Combine(ct::dvec3((double)vX, (double)vY, (double)vZ));

    bool exist = false;
    if (voxelId.find(m_KeyFrame) != voxelId.end()) {
        auto& vidk = voxelId.at(m_KeyFrame);
        if (vidk.find(vX) != vidk.end()) {
            auto& vidkx = vidk.at(vX);
            if (vidkx.find(vY) != vidkx.end()) {
                auto& vidkxy = vidkx.at(vY);
                if (vidkxy.find(vZ) != vidkxy.end()) {
                    exist = true;
                }
            }
        }
    }

    if (!exist) {
        auto& xyzi = vCube->xyzis[m_KeyFrame];
        xyzi.voxels.push_back(Wrap(vX, m_MaxVoxelPerCubeX));                      // x
        xyzi.voxels.push_back(Wrap(vY, m_MaxVoxelPerCubeY));                      // y
        xyzi.voxels.push_back(Wrap(vZ, m_MaxVoxelPerCubeZ));                      // z

        // correspond a la loc de la couleur du voxel en question
        voxelId[m_KeyFrame][vX][vY][vZ] = (int)xyzi.voxels.size();

        xyzi.voxels.push_back(vColorIndex);  // color index
    }
}